

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viface.cpp
# Opt level: O0

void __thiscall viface::VIfaceImpl::down(VIfaceImpl *this)

{
  int iVar1;
  ostream *poVar2;
  int *piVar3;
  char *pcVar4;
  runtime_error *this_00;
  string local_200 [32];
  ostringstream local_1e0 [8];
  ostringstream what;
  string local_58 [32];
  undefined1 local_38 [8];
  ifreq ifr;
  VIfaceImpl *this_local;
  
  iVar1 = this->kernel_socket;
  ifr.ifr_ifru._16_8_ = this;
  std::__cxx11::string::string(local_58,(string *)&this->name);
  read_flags(iVar1,(string *)local_58,(ifreq *)local_38);
  std::__cxx11::string::~string(local_58);
  ifr.ifr_ifrn._8_2_ = ifr.ifr_ifrn._8_2_ & 0xfffe;
  iVar1 = ioctl(this->kernel_socket,0x8914,local_38);
  if (iVar1 != 0) {
    std::__cxx11::ostringstream::ostringstream(local_1e0);
    poVar2 = std::operator<<((ostream *)local_1e0,"--- Unable to bring-down interface ");
    std::operator<<(poVar2,(string *)&this->name);
    poVar2 = std::operator<<((ostream *)local_1e0,".");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)local_1e0,"    Error: ");
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    std::operator<<(poVar2,pcVar4);
    poVar2 = std::operator<<((ostream *)local_1e0," (");
    piVar3 = __errno_location();
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*piVar3);
    poVar2 = std::operator<<(poVar2,").");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(this_00,local_200);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void VIfaceImpl::down() const
{
    // Read interface flags
    struct ifreq ifr;
    read_flags(this->kernel_socket, this->name, ifr);

    // Bring-down interface
    ifr.ifr_flags &= ~IFF_UP;
    if (ioctl(this->kernel_socket, SIOCSIFFLAGS, &ifr) != 0) {
        ostringstream what;
        what << "--- Unable to bring-down interface " << this->name;
        what << "." << endl;
        what << "    Error: " << strerror(errno);
        what << " (" << errno << ")." << endl;
        throw runtime_error(what.str());
    }

    return;
}